

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O0

LoopSetInst * __thiscall
UnifiedRegex::Matcher::LabelToInstPointer<UnifiedRegex::LoopSetInst>
          (Matcher *this,InstTag tag,Label label)

{
  code *pcVar1;
  bool bVar2;
  Program *pPVar3;
  undefined4 *puVar4;
  uchar **ppuVar5;
  Label label_local;
  InstTag tag_local;
  Matcher *this_local;
  
  pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  if ((ulong)(pPVar3->rep).insts.instsLen < (ulong)label + 0x36) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                      ((WriteBarrierPtr *)&(pPVar3->rep).insts);
  if ((*ppuVar5)[label] != tag) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                      ((WriteBarrierPtr *)&(pPVar3->rep).insts);
  return (LoopSetInst *)(*ppuVar5 + label);
}

Assistant:

inline T* LabelToInstPointer(Inst::InstTag tag, Label label) const
        {
            Assert(label + sizeof(T) <= program->rep.insts.instsLen);
            Assert(((Inst*)(program->rep.insts.insts + label))->tag == tag);
            return (T*)(program->rep.insts.insts + label);
        }